

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O2

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstFunctionCall> *cExpr,int priority)

{
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  Type TVar1;
  int iVar2;
  undefined8 uVar3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  shared_ptr<nigel::AstReturning> sVar5;
  shared_ptr<nigel::AstTerm> clTerm;
  key_type local_7c;
  undefined1 local_78 [32];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_38;
  
  local_78._16_8_ = CONCAT44(in_register_0000000c,priority);
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  local_78._24_8_ = this;
  local_38 = (element_type *)currLVal;
  do {
    TVar1 = (((cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_AstReturning).super_AstExpr.type;
    if (TVar1 == term) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)&local_58);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)
                                    &local_58[1].super_enable_shared_from_this<nigel::Token>);
      if (in_R8D <= *pmVar4) goto LAB_0014feed;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    }
    else {
LAB_0014feed:
      local_7c = op_set;
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,&local_7c);
      if (*pmVar4 != in_R8D) {
        if (TVar1 == term) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        }
LAB_0014ffa3:
        if (local_48._M_ptr == (element_type *)0x0) {
          std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)
                     &local_38[2].super_enable_shared_from_this<nigel::Token>._M_weak_this.
                      super___weak_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (__shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2> *)
                     local_78._16_8_);
        }
        else {
          std::__shared_ptr<nigel::AstReturning,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<nigel::AstReturning,(__gnu_cxx::_Lock_policy)2> *)
                     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_48._M_ptr + 0x40))->_M_use_count,
                     (__shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2> *)
                     local_78._16_8_);
        }
        uVar3 = local_78._24_8_;
        AstExpr::as<nigel::AstReturning>((AstExpr *)local_78._24_8_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = extraout_RDX._M_pi;
        sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar3;
        return (shared_ptr<nigel::AstReturning>)
               sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
      }
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_78);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_78._0_8_ + 0x58));
      iVar2 = *pmVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      if (TVar1 == term) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      }
      if (iVar2 != in_R8D) goto LAB_0014ffa3;
    }
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_78);
    std::__shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_48,(__shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_78);
    std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)cExpr,
               (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)
               (local_78._0_8_ + 0x48));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstFunctionCall> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstTerm> clTerm = nullptr;
		while( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
			( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstTerm>();
			currLVal = currLVal->as<AstTerm>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}